

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

int compute_string_width_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  Am_String string;
  Am_Object screen;
  Am_Font font;
  
  pAVar3 = Am_Object::Get(self,0xac,0);
  Am_Font::Am_Font(&font,pAVar3);
  pAVar3 = Am_Object::Get(self,0xab,0);
  Am_String::Am_String(&string,pAVar3);
  bVar1 = Am_String::Valid(&string);
  if (bVar1) {
    Am_GV_Screen(&screen);
    pcVar4 = Am_String::operator_cast_to_char_(&string);
    sVar5 = strlen(pcVar4);
    pcVar4 = Am_String::operator_cast_to_char_(&string);
    iVar2 = Am_Get_String_Width(&screen,&font,pcVar4,(int)sVar5);
    iVar6 = 10;
    if (10 < iVar2) {
      iVar6 = iVar2;
    }
    Am_Object::~Am_Object(&screen);
  }
  else {
    iVar6 = 10;
  }
  Am_String::~Am_String(&string);
  Am_Font::~Am_Font(&font);
  return iVar6;
}

Assistant:

Am_Define_Formula(int, compute_string_width)
{
  Am_Font font(self.Get(Am_FONT));
  Am_String string(self.Get(Am_TEXT));

  if (string.Valid()) {
    Am_Object screen = Am_GV_Screen(self);
    int str_len = strlen(string);
    int width = Am_Get_String_Width(screen, font, string, str_len);

    // assure text boxes are always at least 10 pixels wide so you can click
    return width > 10 ? width : 10;
  } else
    return 10;
}